

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfsfileengine.cpp
# Opt level: O3

qint64 __thiscall QFSFileEngine::readLine(QFSFileEngine *this,char *data,qint64 maxlen)

{
  QFSFileEnginePrivate *this_00;
  qint64 qVar1;
  
  this_00 = (QFSFileEnginePrivate *)(this->super_QAbstractFileEngine).d_ptr.d;
  if (this_00->lastIOCommand != IOReadCommand) {
    (*(this->super_QAbstractFileEngine)._vptr_QAbstractFileEngine[4])();
    this_00->lastIOCommand = IOReadCommand;
  }
  qVar1 = QFSFileEnginePrivate::nativeReadLine(this_00,data,maxlen);
  return qVar1;
}

Assistant:

qint64 QFSFileEngine::readLine(char *data, qint64 maxlen)
{
    Q_D(QFSFileEngine);

    // On Windows' stdlib implementation, the results of calling fread and
    // fwrite are undefined if not called either in sequence, or if preceded
    // with a call to fflush().
    if (d->lastIOCommand != QFSFileEnginePrivate::IOReadCommand) {
        flush();
        d->lastIOCommand = QFSFileEnginePrivate::IOReadCommand;
    }

    return d->nativeReadLine(data, maxlen);
}